

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::throwError(StructuralParser *this,CompileMessage *message)

{
  CompileMessage local_68;
  Context local_30;
  CompileMessage *local_18;
  CompileMessage *message_local;
  StructuralParser *this_local;
  
  local_18 = message;
  message_local = (CompileMessage *)this;
  getContext(&local_30,this);
  CompileMessage::CompileMessage(&local_68,local_18);
  AST::Context::throwError(&local_30,&local_68,false);
}

Assistant:

[[noreturn]] void throwError (const CompileMessage& message) const override
    {
        getContext().throwError (message);
    }